

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  long lVar1;
  double dVar2;
  double dVar3;
  GLFWgammaramp ramp;
  unsigned_short values [256];
  GLFWgammaramp local_238;
  unsigned_short local_218 [260];
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("handle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/glfw/src/monitor.c"
                  ,0x16e,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (NAN(gamma)) {
    __assert_fail("gamma == gamma",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/glfw/src/monitor.c"
                  ,0x16f,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (gamma < 0.0) {
    __assert_fail("gamma >= 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/glfw/src/monitor.c"
                  ,0x170,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (gamma <= 3.4028235e+38) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      return;
    }
    if ((0.0 < gamma) && (gamma <= 3.4028235e+38)) {
      lVar1 = 0;
      do {
        dVar2 = pow((double)(int)lVar1 / 255.0,1.0 / (double)gamma);
        dVar3 = dVar2 * 65535.0 + 0.5;
        dVar2 = 65535.0;
        if (dVar3 <= 65535.0) {
          dVar2 = dVar3;
        }
        local_218[lVar1] = (unsigned_short)(int)dVar2;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x100);
      local_238.red = local_218;
      local_238.size = 0x100;
      local_238.green = local_238.red;
      local_238.blue = local_238.red;
      glfwSetGammaRamp(handle,&local_238);
      return;
    }
    _glfwInputError(0x10004,"Invalid gamma value %f",(double)gamma);
    return;
  }
  __assert_fail("gamma <= FLT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/glfw/src/monitor.c"
                ,0x171,"void glfwSetGamma(GLFWmonitor *, float)");
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    int i;
    unsigned short values[256];
    GLFWgammaramp ramp;
    assert(handle != NULL);
    assert(gamma == gamma);
    assert(gamma >= 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    for (i = 0;  i < 256;  i++)
    {
        double value;

        // Calculate intensity
        value = i / 255.0;
        // Apply gamma curve
        value = pow(value, 1.0 / gamma) * 65535.0 + 0.5;

        // Clamp to value range
        if (value > 65535.0)
            value = 65535.0;

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = 256;

    glfwSetGammaRamp(handle, &ramp);
}